

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DictionaryStats.cpp
# Opt level: O1

void DictionaryStats::OutputStats(void)

{
  DictionaryType *pDVar1;
  DictionaryStats *pDVar2;
  DictionaryType *type;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double local_98;
  double local_90;
  double local_88;
  double local_80;
  double local_78;
  double local_70;
  double local_68;
  double local_60;
  double local_58;
  double local_40;
  double local_38;
  
  if (dictionaryTypes != (DictionaryType *)0x0) {
    CCLock::Enter(&dictionaryTypesCriticalSection.super_CCLock);
    pDVar1 = dictionaryTypes;
    Output::Print(L"PROFILE DICTIONARY\n");
    Output::Print(L"%8s  %13s  %13s  %13s  %13s  %13s  %13s  %13s  %14s  %14s  %13s  %13s  %13s    %s\n"
                  ,L"Metric",L"StartSize",L"EndSize",L"Resizes",L"Items",L"MaxDepth",L"EmptyBuckets"
                  ,L"Lookups",L"Collisions",L"AvgLookupDepth",L"AvgCollDepth",L"MaxLookupDepth",
                  L"Instances",L"Type");
    for (; pDVar1 != (DictionaryType *)0x0; pDVar1 = pDVar1->pNext) {
      pDVar2 = pDVar1->instances;
      if (pDVar2 == (DictionaryStats *)0x0) {
        local_98 = 0.0;
        dVar3 = 0.0;
        local_40 = 0.0;
        local_38 = 0.0;
        dVar4 = 0.0;
        dVar5 = 0.0;
        dVar6 = 0.0;
        dVar7 = 0.0;
        dVar8 = 0.0;
        dVar14 = 0.0;
      }
      else {
        local_90 = 0.0;
        local_58 = 0.0;
        local_60 = 0.0;
        local_88 = 0.0;
        local_38 = 0.0;
        local_80 = 0.0;
        dVar8 = 0.0;
        dVar9 = 0.0;
        dVar7 = 0.0;
        dVar6 = 0.0;
        local_78 = 0.0;
        dVar5 = 0.0;
        local_70 = 0.0;
        dVar4 = 0.0;
        local_68 = 0.0;
        dVar3 = 0.0;
        local_98 = 0.0;
        dVar15 = 0.0;
        dVar17 = 0.0;
        do {
          dVar18 = (double)pDVar2->lookupCount;
          dVar14 = local_60;
          if ((pDVar2->lookupCount != 0) &&
             (dVar14 = (double)pDVar2->lookupDepthTotal / dVar18, dVar14 <= local_60)) {
            dVar14 = local_60;
          }
          local_60 = dVar14;
          dVar10 = (double)pDVar2->collisionCount;
          dVar14 = local_58;
          if ((pDVar2->collisionCount != 0) &&
             (dVar14 = (double)pDVar2->lookupDepthTotal / dVar10, dVar14 <= local_58)) {
            dVar14 = local_58;
          }
          local_58 = dVar14;
          dVar14 = (double)pDVar2->initialSize;
          local_98 = local_98 + dVar14;
          if (dVar14 <= dVar15) {
            dVar14 = dVar15;
          }
          dVar13 = (double)pDVar2->finalSize;
          dVar3 = dVar3 + dVar13;
          if (dVar13 <= local_68) {
            dVar13 = local_68;
          }
          dVar12 = (double)pDVar2->countOfResize;
          dVar4 = dVar4 + dVar12;
          if (dVar12 <= local_70) {
            dVar12 = local_70;
          }
          dVar16 = (double)pDVar2->itemCount;
          dVar5 = dVar5 + dVar16;
          local_40 = (double)pDVar2->maxDepth;
          if (dVar16 <= local_78) {
            dVar16 = local_78;
          }
          dVar6 = dVar6 + local_40;
          if (local_40 <= dVar17) {
            local_40 = dVar17;
          }
          dVar15 = (double)pDVar2->countOfEmptyBuckets;
          dVar7 = dVar7 + dVar15;
          if (dVar15 <= dVar9) {
            dVar15 = dVar9;
          }
          dVar9 = dVar15;
          dVar8 = dVar8 + dVar18;
          if (dVar18 <= local_80) {
            dVar18 = local_80;
          }
          local_38 = local_38 + dVar10;
          if (dVar10 <= local_88) {
            dVar10 = local_88;
          }
          dVar11 = (double)pDVar2->maxLookupDepth;
          if ((double)pDVar2->maxLookupDepth <= local_90) {
            dVar11 = local_90;
          }
          pDVar2 = pDVar2->pNext;
          dVar15 = dVar14;
          dVar17 = local_40;
          local_90 = dVar11;
          local_88 = dVar10;
          local_80 = dVar18;
          local_78 = dVar16;
          local_70 = dVar12;
          local_68 = dVar13;
        } while (pDVar2 != (DictionaryStats *)0x0);
      }
      if ((double)DAT_015c4a8c <= local_40) {
        dVar15 = (double)pDVar1->instancesCount;
        Output::Print(L"%8s  %13.0f  %13.0f  %13.2f  %13.0f  %13.2f  %13.0f  %13.0f  %14.0f  %14.2f  %13.2f  %13.2f  %13d    %S\n"
                      ,local_98 / dVar15,dVar3 / dVar15,dVar4 / dVar15,dVar5 / dVar15,dVar6 / dVar15
                      ,dVar7 / dVar15,dVar8 / dVar15,local_38 / dVar15,L"AVG:",
                      (ulong)(uint)pDVar1->instancesCount,pDVar1->name);
        Output::Print(L"%8s  %13.0f  %13.0f  %13.2f  %13.0f  %13.2f  %13.0f  %13.0f  %14.0f  %14.2f  %13.2f  %13.2f  %13d    %S\n\n"
                      ,dVar14,L"MAX:",(ulong)(uint)pDVar1->instancesCount,pDVar1->name);
      }
    }
    Output::Print(
                 L"====================================================================================\n"
                 );
    ClearStats();
    CCLock::Leave(&dictionaryTypesCriticalSection.super_CCLock);
    return;
  }
  return;
}

Assistant:

void DictionaryStats::OutputStats()
{
    if (!dictionaryTypes)
        return;

    DictionaryStats::dictionaryTypesCriticalSection.Enter();
    DictionaryType* current = dictionaryTypes;
    Output::Print(_u("PROFILE DICTIONARY\n"));
    Output::Print(_u("%8s  %13s  %13s  %13s  %13s  %13s  %13s  %13s  %14s  %14s  %13s  %13s  %13s    %s\n"), _u("Metric"),_u("StartSize"), _u("EndSize"), _u("Resizes"), _u("Items"), _u("MaxDepth"), _u("EmptyBuckets"), _u("Lookups"), _u("Collisions"), _u("AvgLookupDepth"), _u("AvgCollDepth"), _u("MaxLookupDepth"), _u("Instances"), _u("Type"));
    while(current)
    {
        DictionaryType *type = current;

        DictionaryStats *instance = type->instances;
        double size = 0, max_size = 0;
        double endSize = 0, max_endSize = 0;
        double resizes = 0, max_resizes = 0;
        double items = 0, max_items = 0;
        double depth = 0, max_depth = 0;
        double empty = 0, max_empty = 0;
        double lookups = 0, max_lookups = 0;
        double collisions = 0, max_collisions = 0;
        double avglookupdepth = 0, max_avglookupdepth = 0;
        double avgcollisiondepth = 0, max_avgcollisiondepth = 0;
        double maxlookupdepth = 0, max_maxlookupdepth = 0;

        bool dumpInstances = false;
        //if(strstr(type->name, "SimpleDictionaryPropertyDescriptor") != nullptr)
        //{
        //    dumpInstances = true;
        //}
        while(instance)
        {
            ComputeStats(instance->initialSize, size, max_size);
            ComputeStats(instance->finalSize, endSize, max_endSize);
            ComputeStats(instance->countOfResize, resizes, max_resizes);
            ComputeStats(instance->itemCount, items, max_items);
            ComputeStats(instance->maxDepth, depth, max_depth);
            ComputeStats(instance->countOfEmptyBuckets, empty, max_empty);
            ComputeStats(instance->lookupCount, lookups, max_lookups);
            ComputeStats(instance->collisionCount, collisions, max_collisions);
            if (instance->lookupCount > 0)
            {
                ComputeStats((double)instance->lookupDepthTotal / (double)instance->lookupCount, avglookupdepth, max_avglookupdepth);
            }
            if (instance->collisionCount > 0)
            {
                ComputeStats((double)instance->lookupDepthTotal / (double)instance->collisionCount, avgcollisiondepth, max_avgcollisiondepth);
            }
            ComputeStats(instance->maxLookupDepth, maxlookupdepth, max_maxlookupdepth);

            if(dumpInstances)
            {
                double avgld = 0.0;
                double avgcd = 0.0;
                if (instance->lookupCount > 0)
                {
                    avgld = (double)instance->lookupDepthTotal / (double)instance->lookupCount;
                    avgcd = (double)instance->lookupDepthTotal / (double)instance->collisionCount;
                }
                Output::Print(_u("%8s  %13d  %13d  %13d  %13d  %13d  %13d  %13d  %14d  %14.2f  %13.2f  %13d \n"),
                    _u("INS:"),
                    instance->initialSize, instance->finalSize, instance->countOfResize,
                    instance->itemCount, instance->maxDepth, instance->countOfEmptyBuckets,
                    instance->lookupCount, instance->collisionCount, avgld, avgcd,
                    instance->maxLookupDepth);
            }
            instance = instance->pNext;
        }

        if (max_depth >= Js::Configuration::Global.flags.ProfileDictionary)
        {
            Output::Print(_u("%8s  %13.0f  %13.0f  %13.2f  %13.0f  %13.2f  %13.0f  %13.0f  %14.0f  %14.2f  %13.2f  %13.2f  %13d    %S\n"), _u("AVG:"),
                size/type->instancesCount, endSize/type->instancesCount, resizes/type->instancesCount, items/type->instancesCount,
                depth/type->instancesCount, empty/type->instancesCount, lookups/type->instancesCount, collisions/type->instancesCount,
                avglookupdepth/type->instancesCount, avgcollisiondepth/type->instancesCount, maxlookupdepth/type->instancesCount, type->instancesCount, type->name);
            Output::Print(_u("%8s  %13.0f  %13.0f  %13.2f  %13.0f  %13.2f  %13.0f  %13.0f  %14.0f  %14.2f  %13.2f  %13.2f  %13d    %S\n\n"), _u("MAX:"),
                max_size, max_endSize, max_resizes, max_items, max_depth, max_empty, max_lookups, max_collisions, max_avglookupdepth,
                max_avgcollisiondepth, max_maxlookupdepth, type->instancesCount, type->name);

        }
        current = current->pNext;
    }
    Output::Print(_u("====================================================================================\n"));
    ClearStats();
    DictionaryStats::dictionaryTypesCriticalSection.Leave();
}